

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetTest(XL *out,string *test_path)

{
  HyperParam *pHVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  pHVar1 = XLearn::GetHyperParam((XLearn *)*in_RDI);
  std::__cxx11::string::operator=(in_RSI,(string *)&pHVar1->test_set_file);
  return 0;
}

Assistant:

XL_DLL int XLearnGetTest(XL *out, std::string& test_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  test_path = xl->GetHyperParam().test_set_file;
  API_END();
}